

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeContextCreatePrologue
          (ZEParameterValidation *this,ze_driver_handle_t hDriver,ze_context_desc_t *desc,
          ze_context_handle_t *phContext)

{
  ze_result_t zVar1;
  
  if (hDriver == (ze_driver_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  if ((phContext != (ze_context_handle_t *)0x0 && desc != (ze_context_desc_t *)0x0) &&
     (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->flags < 2)) {
    zVar1 = ParameterValidation::validateExtensions<_ze_context_desc_t_const*>(desc);
    return zVar1;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeContextCreatePrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver object
        const ze_context_desc_t* desc,                  ///< [in] pointer to context descriptor
        ze_context_handle_t* phContext                  ///< [out] pointer to handle of context object created
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phContext )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x1 < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }